

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O3

void pzgeom::TPZArc3D::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  int iVar2;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZArc3D> *this_00;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  TPZManVector<long,_3> indexes;
  TPZManVector<double,_3> cods;
  double local_f0;
  TPZVec<long> local_e8;
  long local_c8 [3];
  TPZManVector<double,_3> local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar4 = &local_78;
  uStack_70 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  lVar5 = 0;
  local_38 = 0;
  local_78 = 0x3ff0000000000000;
  local_58 = 0x3ff0000000000000;
  local_48 = 0x3fe6a09e667f3bcd;
  uStack_40 = 0x3fe6a09e667f3bcd;
  pdVar1 = size->fStore;
  *pdVar1 = 1.0;
  pdVar1[1] = 1.0;
  TPZVec<long>::TPZVec(&local_e8,0);
  local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b688;
  local_e8.fStore = local_c8;
  local_e8.fNElements = 3;
  local_e8.fNAlloc = 0;
  do {
    local_f0 = 0.0;
    TPZManVector<double,_3>::TPZManVector(&local_b0,3,&local_f0);
    pdVar1 = lowercorner->fStore;
    lVar3 = 0;
    do {
      local_b0.super_TPZVec<double>.fStore[lVar3] = pdVar1[lVar3] + (double)puVar4[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_e8.fStore[lVar5] = (long)iVar2;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar2);
    TPZGeoNode::Initialize(this,&local_b0.super_TPZVec<double>,gmesh);
    TPZManVector<double,_3>::~TPZManVector(&local_b0);
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + 3;
  } while (lVar5 != 3);
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZArc3D> *)operator_new(800);
  TPZGeoElRefPattern<pzgeom::TPZArc3D>::TPZGeoElRefPattern(this_00,&local_e8,matid,gmesh);
  if (local_e8.fStore != local_c8) {
    local_e8.fNAlloc = 0;
    local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_e8.fStore != (long *)0x0) {
      operator_delete__(local_e8.fStore);
    }
  }
  return;
}

Assistant:

void TPZArc3D::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    REAL coords[3][3] = {
        {1,0,0},
        {0,1,0},
        {M_SQRT1_2,M_SQRT1_2,0}
    };
    size[0] = 1.;
    size[1] = 1.;
    
    TPZManVector<int64_t,3> indexes(3);
    for (int i=0; i<3; i++) {
        TPZManVector<REAL,3> cods(3,0.);
        for (int j=0; j<3; j++) {
            cods[j] = lowercorner[j]+coords[i][j];
        }
        indexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[indexes[i]].Initialize(cods, gmesh);
    }
    TPZGeoElRefPattern<TPZArc3D> *gel = new TPZGeoElRefPattern<TPZArc3D>(indexes,matid,gmesh);
}